

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditSeedBuilderTests.cpp
# Opt level: O2

IterateResult __thiscall
dit::anon_unknown_0::SeedBuilderMultipleValuesTest::iterate(SeedBuilderMultipleValuesTest *this)

{
  ostringstream *poVar1;
  TestLog *pTVar2;
  SeedBuilder *builder;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  SeedBuilder builderAB;
  SeedBuilder builderB;
  SeedBuilder builderA;
  MessageBuilder local_1a8;
  
  pTVar2 = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  tcu::SeedBuilder::SeedBuilder(&builderA);
  tcu::SeedBuilder::SeedBuilder(&builderB);
  tcu::SeedBuilder::SeedBuilder(&builderAB);
  tcu::operator<<(&builderA,0x4a238ab);
  tcu::operator<<(&builderB,0xe455bd08);
  builder = tcu::operator<<(&builderAB,0x4a238ab);
  tcu::operator<<(builder,0xe455bd08);
  poVar1 = &local_1a8.m_str;
  local_1a8.m_log = pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Value a: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<((ostream *)poVar1,", Seed a: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  poVar1 = &local_1a8.m_str;
  local_1a8.m_log = pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Value b: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<((ostream *)poVar1,", Seed b: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  poVar1 = &local_1a8.m_str;
  local_1a8.m_log = pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Seed ab: ");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<(&local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  if (builderA.m_hash == builderAB.m_hash) {
    this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
    description = "Seed seems to only depends on first value.";
  }
  else {
    this_00 = (this->super_TestCase).super_TestNode.m_testCtx;
    if (builderB.m_hash != builderAB.m_hash) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_0017d051;
    }
    description = "Seed seems to only depends on second value.";
  }
  testResult = QP_TEST_RESULT_FAIL;
LAB_0017d051:
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

IterateResult iterate (void)
	{
		TestLog&			log			= m_testCtx.getLog();
		const deUint32		a			= 77740203u;
		const deUint32		b			= 3830824200u;

		tcu::SeedBuilder	builderA;
		tcu::SeedBuilder	builderB;
		tcu::SeedBuilder	builderAB;

		builderA << a;
		builderB << b;

		builderAB << a << b;

		log << TestLog::Message << "Value a: " << a << ", Seed a: " << builderA.get() << TestLog::EndMessage;
		log << TestLog::Message << "Value b: " << b << ", Seed b: " << builderB.get() << TestLog::EndMessage;
		log << TestLog::Message << "Seed ab: " << builderAB.get() << TestLog::EndMessage;

		if (builderA.get() == builderAB.get())
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Seed seems to only depends on first value.");
		else if (builderB.get() == builderAB.get())
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Seed seems to only depends on second value.");
		else
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		return STOP;
	}